

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absGlaOld.c
# Opt level: O0

int Gla_ManGetOutLit(Gla_Man_t *p,int f)

{
  int Var;
  Gla_Obj_t *pGVar1;
  int iSat;
  Gla_Obj_t *pFanin;
  int f_local;
  Gla_Man_t *p_local;
  
  pGVar1 = Gla_ManObj(p,p->pObjRoot->Fanins[0]);
  Var = Vec_IntEntry(&pGVar1->vFrames,f);
  if (0 < Var) {
    if (((f == 0) && ((*(uint *)&pGVar1->field_0x4 >> 5 & 1) != 0)) &&
       ((*(uint *)&p->pObjRoot->field_0x4 >> 1 & 1) == 0)) {
      p_local._4_4_ = -1;
    }
    else {
      p_local._4_4_ = Abc_Var2Lit(Var,*(uint *)&p->pObjRoot->field_0x4 >> 1 & 1);
    }
    return p_local._4_4_;
  }
  __assert_fail("iSat > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/abs/absGlaOld.c"
                ,0x5a0,"int Gla_ManGetOutLit(Gla_Man_t *, int)");
}

Assistant:

int Gla_ManGetOutLit( Gla_Man_t * p, int f )
{
    Gla_Obj_t * pFanin = Gla_ManObj( p, p->pObjRoot->Fanins[0] );
    int iSat = Vec_IntEntry( &pFanin->vFrames, f );
    assert( iSat > 0 );
    if ( f == 0 && pFanin->fRo && !p->pObjRoot->fCompl0 )
        return -1;
    return Abc_Var2Lit( iSat, p->pObjRoot->fCompl0 );
}